

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MemPass::RemovePhiOperands
          (MemPass *this,Instruction *phi,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *reachable_blocks)

{
  initializer_list<unsigned_int> init_list;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  Operand *pOVar5;
  CFG *this_00;
  DefUseManager *this_01;
  IRContext *pIVar6;
  bool local_119;
  uint32_t local_f4;
  iterator local_f0;
  undefined8 local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  Operand local_b8;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> local_88;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> local_80;
  BasicBlock *local_78;
  BasicBlock *def_block;
  Instruction *arg_def_instr;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> _Stack_60;
  uint32_t arg_id;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> local_58;
  BasicBlock *local_50;
  BasicBlock *in_block;
  uint32_t local_40;
  uint32_t i;
  uint32_t undef_id;
  uint32_t type_id;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> keep_operands;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *reachable_blocks_local;
  Instruction *phi_local;
  MemPass *this_local;
  
  keep_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)reachable_blocks;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&undef_id);
  i = 0;
  local_40 = 0;
  in_block._4_4_ = 0;
  while( true ) {
    while( true ) {
      uVar1 = in_block._4_4_;
      uVar4 = opt::Instruction::NumOperands(phi);
      uVar2 = in_block._4_4_;
      if (uVar4 <= uVar1) {
        pIVar6 = Pass::context(&this->super_Pass);
        IRContext::ForgetUses(pIVar6,phi);
        opt::Instruction::ReplaceOperands(phi,(OperandList *)&undef_id);
        pIVar6 = Pass::context(&this->super_Pass);
        IRContext::AnalyzeUses(pIVar6,phi);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &undef_id);
        return;
      }
      if (1 < in_block._4_4_) break;
      pOVar5 = opt::Instruction::GetOperand(phi,in_block._4_4_);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &undef_id,pOVar5);
      in_block._4_4_ = in_block._4_4_ + 1;
    }
    bVar3 = false;
    if ((in_block._4_4_ & 1) == 0) {
      uVar4 = opt::Instruction::NumOperands(phi);
      bVar3 = false;
      if (uVar2 < uVar4 - 1) {
        bVar3 = true;
      }
    }
    if (!bVar3) break;
    this_00 = Pass::cfg(&this->super_Pass);
    uVar4 = opt::Instruction::GetSingleWordOperand(phi,in_block._4_4_ + 1);
    local_50 = CFG::block(this_00,uVar4);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
         ::find((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                 *)keep_operands.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_50);
    _Stack_60._M_cur =
         (__node_type *)
         std::
         unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
         ::end((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                *)keep_operands.
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = std::__detail::operator==(&local_58,&stack0xffffffffffffffa0);
    if (bVar3) {
      in_block._4_4_ = in_block._4_4_ + 2;
    }
    else {
      arg_def_instr._4_4_ = opt::Instruction::GetSingleWordOperand(phi,in_block._4_4_);
      this_01 = Pass::get_def_use_mgr(&this->super_Pass);
      def_block = (BasicBlock *)analysis::DefUseManager::GetDef(this_01,arg_def_instr._4_4_);
      pIVar6 = Pass::context(&this->super_Pass);
      local_78 = IRContext::get_instr_block(pIVar6,(Instruction *)def_block);
      local_119 = false;
      if (local_78 != (BasicBlock *)0x0) {
        local_80._M_cur =
             (__node_type *)
             std::
             unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
             ::find((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)keep_operands.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_78);
        local_88._M_cur =
             (__node_type *)
             std::
             unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
             ::end((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)keep_operands.
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_119 = std::__detail::operator==(&local_80,&local_88);
      }
      if (local_119 == false) {
        pOVar5 = opt::Instruction::GetOperand(phi,in_block._4_4_);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &undef_id,pOVar5);
      }
      else {
        if (local_40 == 0) {
          i = opt::Instruction::type_id((Instruction *)def_block);
          local_40 = Type2Undef(this,i);
        }
        local_f4 = local_40;
        local_f0 = &local_f4;
        local_e8 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_f0;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list);
        Operand::Operand(&local_b8,SPV_OPERAND_TYPE_ID,&local_e0);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &undef_id,&local_b8);
        Operand::~Operand(&local_b8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
      }
      pOVar5 = opt::Instruction::GetOperand(phi,in_block._4_4_ + 1);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &undef_id,pOVar5);
      in_block._4_4_ = in_block._4_4_ + 2;
    }
  }
  __assert_fail("i % 2 == 0 && i < phi->NumOperands() - 1 && \"malformed Phi arguments\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp"
                ,0x163,
                "void spvtools::opt::MemPass::RemovePhiOperands(Instruction *, const std::unordered_set<BasicBlock *> &)"
               );
}

Assistant:

void MemPass::RemovePhiOperands(
    Instruction* phi, const std::unordered_set<BasicBlock*>& reachable_blocks) {
  std::vector<Operand> keep_operands;
  uint32_t type_id = 0;
  // The id of an undefined value we've generated.
  uint32_t undef_id = 0;

  // Traverse all the operands in |phi|. Build the new operand vector by adding
  // all the original operands from |phi| except the unwanted ones.
  for (uint32_t i = 0; i < phi->NumOperands();) {
    if (i < 2) {
      // The first two arguments are always preserved.
      keep_operands.push_back(phi->GetOperand(i));
      ++i;
      continue;
    }

    // The remaining Phi arguments come in pairs. Index 'i' contains the
    // variable id, index 'i + 1' is the originating block id.
    assert(i % 2 == 0 && i < phi->NumOperands() - 1 &&
           "malformed Phi arguments");

    BasicBlock* in_block = cfg()->block(phi->GetSingleWordOperand(i + 1));
    if (reachable_blocks.find(in_block) == reachable_blocks.end()) {
      // If the incoming block is unreachable, remove both operands as this
      // means that the |phi| has lost an incoming edge.
      i += 2;
      continue;
    }

    // In all other cases, the operand must be kept but may need to be changed.
    uint32_t arg_id = phi->GetSingleWordOperand(i);
    Instruction* arg_def_instr = get_def_use_mgr()->GetDef(arg_id);
    BasicBlock* def_block = context()->get_instr_block(arg_def_instr);
    if (def_block &&
        reachable_blocks.find(def_block) == reachable_blocks.end()) {
      // If the current |phi| argument was defined in an unreachable block, it
      // means that this |phi| argument is no longer defined. Replace it with
      // |undef_id|.
      if (!undef_id) {
        type_id = arg_def_instr->type_id();
        undef_id = Type2Undef(type_id);
      }
      keep_operands.push_back(
          Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {undef_id}));
    } else {
      // Otherwise, the argument comes from a reachable block or from no block
      // at all (meaning that it was defined in the global section of the
      // program).  In both cases, keep the argument intact.
      keep_operands.push_back(phi->GetOperand(i));
    }

    keep_operands.push_back(phi->GetOperand(i + 1));

    i += 2;
  }

  context()->ForgetUses(phi);
  phi->ReplaceOperands(keep_operands);
  context()->AnalyzeUses(phi);
}